

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_> * __thiscall
TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::operator=
          (TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_> *this,
          TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_> *o)

{
  hash_t size;
  
  this->NumUsed = 0;
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  size = CountUsed(o);
  SetNodeVector(this,size);
  CopyNodes(this,o->Nodes,o->Size);
  return this;
}

Assistant:

TMap &operator= (const TMap &o)
	{
		NumUsed = 0;
		ClearNodeVector();
		SetNodeVector(o.CountUsed());
		CopyNodes(o.Nodes, o.Size);
		return *this;
	}